

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::condition(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int maxiters,
           number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *tolerance)

{
  int p_dim;
  type_conflict5 tVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  int iVar2;
  uint uVar3;
  long i;
  uint uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_4e8;
  double local_498;
  uint local_48c;
  cpp_dec_float<100U,_int,_void> local_488;
  uint local_434;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_430;
  cpp_dec_float<100U,_int,_void> local_428;
  cpp_dec_float<100U,_int,_void> *local_3d8;
  cpp_dec_float<100U,_int,_void> *local_3d0;
  cpp_dec_float<100U,_int,_void> local_3c8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_378;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_368;
  cpp_dec_float<100U,_int,_void> local_358;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  p_dim = (this->matrix).thesize;
  i = (long)p_dim;
  local_358.fpclass = cpp_dec_float_finite;
  local_358.prec_elem = 0x10;
  local_358.data._M_elems[0] = 0;
  local_358.data._M_elems[1] = 0;
  local_358.data._M_elems[2] = 0;
  local_358.data._M_elems[3] = 0;
  local_358.data._M_elems[4] = 0;
  local_358.data._M_elems[5] = 0;
  local_358.data._M_elems[6] = 0;
  local_358.data._M_elems[7] = 0;
  local_358.data._M_elems[8] = 0;
  local_358.data._M_elems[9] = 0;
  local_358.data._M_elems[10] = 0;
  local_358.data._M_elems[0xb] = 0;
  local_358.data._M_elems[0xc] = 0;
  local_358.data._M_elems[0xd] = 0;
  local_358.data._M_elems._56_5_ = 0;
  local_358.data._M_elems[0xf]._1_3_ = 0;
  local_358.exp = 0;
  local_358.neg = false;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  local_4e8.fpclass = cpp_dec_float_finite;
  local_4e8.prec_elem = 0x10;
  local_4e8.data._M_elems[0xc] = 0;
  local_4e8.data._M_elems[0xd] = 0;
  local_4e8.data._M_elems[0xe] = 0;
  local_4e8.data._M_elems[0xf] = 0;
  local_4e8.exp = 0;
  local_4e8.neg = false;
  local_4e8.data._M_elems[0] = 0;
  local_4e8.data._M_elems[1] = 0;
  local_4e8.data._M_elems[2] = 0;
  local_4e8.data._M_elems[3] = 0;
  local_428.exp = 0;
  local_428.neg = false;
  local_4e8.data._M_elems[4] = 0;
  local_4e8.data._M_elems[5] = 0;
  local_4e8.data._M_elems[6] = 0;
  local_4e8.data._M_elems[7] = 0;
  local_4e8.data._M_elems[8] = 0;
  local_4e8.data._M_elems[9] = 0;
  local_4e8.data._M_elems[10] = 0;
  local_4e8.data._M_elems[0xb] = 0;
  local_428.fpclass = cpp_dec_float_finite;
  local_428.prec_elem = 0x10;
  local_428.data._M_elems[0] = 0;
  local_428.data._M_elems[1] = 0;
  local_428.data._M_elems[2] = 0;
  local_428.data._M_elems[3] = 0;
  local_428.data._M_elems[4] = 0;
  local_428.data._M_elems[5] = 0;
  local_428.data._M_elems[6] = 0;
  local_428.data._M_elems[7] = 0;
  local_428.data._M_elems[8] = 0;
  local_428.data._M_elems[9] = 0;
  local_428.data._M_elems[10] = 0;
  local_428.data._M_elems[0xb] = 0;
  local_428.data._M_elems[0xc] = 0;
  local_428.data._M_elems[0xd] = 0;
  local_428.data._M_elems[0xe] = 0;
  local_428.data._M_elems[0xf] = 0;
  local_3d8 = &__return_storage_ptr__->m_backend;
  local_3d0 = &tolerance->m_backend;
  if (i < 1) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&__return_storage_ptr__->m_backend,1.0,(type *)0x0);
  }
  else {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_368,
               &(this->theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_308,p_dim,(shared_ptr<soplex::Tolerances> *)&local_368);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_378,
               &(this->theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_178,p_dim,(shared_ptr<soplex::Tolerances> *)&local_378);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
    if (this->thestatus < REGULAR) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (local_3d8,0,(type *)0x0);
    }
    else {
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      local_498 = 1.0;
      local_430 = this;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_3c8,i,(type *)0x0);
      local_488.fpclass = cpp_dec_float_finite;
      local_488.prec_elem = 0x10;
      local_488.data._M_elems[0] = 0;
      local_488.data._M_elems[1] = 0;
      local_488.data._M_elems[2] = 0;
      local_488.data._M_elems[3] = 0;
      local_488.data._M_elems[4] = 0;
      local_488.data._M_elems[5] = 0;
      local_488.data._M_elems[6] = 0;
      local_488.data._M_elems[7] = 0;
      local_488.data._M_elems[8] = 0;
      local_488.data._M_elems[9] = 0;
      local_488.data._M_elems[10] = 0;
      local_488.data._M_elems[0xb] = 0;
      local_488.data._M_elems[0xc] = 0;
      local_488.data._M_elems[0xd] = 0;
      local_488.data._M_elems._56_5_ = 0;
      local_488.data._M_elems[0xf]._1_3_ = 0;
      local_488.exp = 0;
      local_488.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&local_488,&local_498,&local_3c8);
      local_4e8.data._M_elems[0xc] = local_488.data._M_elems[0xc];
      local_4e8.data._M_elems[0xd] = local_488.data._M_elems[0xd];
      local_4e8.data._M_elems[0xe] = local_488.data._M_elems[0xe];
      local_4e8.data._M_elems[0xf] =
           (uint)(CONCAT35(local_488.data._M_elems[0xf]._1_3_,local_488.data._M_elems._56_5_) >>
                 0x20);
      local_4e8.data._M_elems[8] = local_488.data._M_elems[8];
      local_4e8.data._M_elems[9] = local_488.data._M_elems[9];
      local_4e8.data._M_elems[10] = local_488.data._M_elems[10];
      local_4e8.data._M_elems[0xb] = local_488.data._M_elems[0xb];
      local_4e8.data._M_elems[4] = local_488.data._M_elems[4];
      local_4e8.data._M_elems[5] = local_488.data._M_elems[5];
      local_4e8.data._M_elems[6] = local_488.data._M_elems[6];
      local_4e8.data._M_elems[7] = local_488.data._M_elems[7];
      local_4e8.data._M_elems[0] = local_488.data._M_elems[0];
      local_4e8.data._M_elems[1] = local_488.data._M_elems[1];
      local_4e8.data._M_elems[2] = local_488.data._M_elems[2];
      local_4e8.data._M_elems[3] = local_488.data._M_elems[3];
      local_4e8.exp = local_488.exp;
      local_4e8.neg = local_488.neg;
      local_4e8.fpclass = local_488.fpclass;
      local_4e8.prec_elem = local_488.prec_elem;
      for (iVar2 = 0; p_dim != iVar2; iVar2 = iVar2 + 1) {
        local_1c8.m_backend.data._M_elems[0xf] = local_4e8.data._M_elems[0xf];
        local_1c8.m_backend.data._M_elems[0xe] = local_4e8.data._M_elems[0xe];
        local_1c8.m_backend.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
        local_1c8.m_backend.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
        local_1c8.m_backend.data._M_elems[8] = local_4e8.data._M_elems[8];
        local_1c8.m_backend.data._M_elems[9] = local_4e8.data._M_elems[9];
        local_1c8.m_backend.data._M_elems[10] = local_4e8.data._M_elems[10];
        local_1c8.m_backend.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
        local_1c8.m_backend.data._M_elems[4] = local_4e8.data._M_elems[4];
        local_1c8.m_backend.data._M_elems[5] = local_4e8.data._M_elems[5];
        local_1c8.m_backend.data._M_elems[6] = local_4e8.data._M_elems[6];
        local_1c8.m_backend.data._M_elems[7] = local_4e8.data._M_elems[7];
        local_1c8.m_backend.data._M_elems[0] = local_4e8.data._M_elems[0];
        local_1c8.m_backend.data._M_elems[1] = local_4e8.data._M_elems[1];
        local_1c8.m_backend.data._M_elems[2] = local_4e8.data._M_elems[2];
        local_1c8.m_backend.data._M_elems[3] = local_4e8.data._M_elems[3];
        local_1c8.m_backend.exp = local_4e8.exp;
        local_1c8.m_backend.neg = local_4e8.neg;
        local_1c8.m_backend.fpclass = local_4e8.fpclass;
        local_1c8.m_backend.prec_elem = local_4e8.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_308,iVar2,&local_1c8);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_178,&local_308);
      uVar4 = 0;
      if (maxiters < 1) {
        maxiters = 0;
      }
      local_434 = maxiters;
      for (; local_434 != uVar4; uVar4 = uVar4 + 1) {
        local_428.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
        local_428.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
        local_428.data._M_elems[0xe] = local_4e8.data._M_elems[0xe];
        local_428.data._M_elems[0xf] = local_4e8.data._M_elems[0xf];
        local_428.data._M_elems[8] = local_4e8.data._M_elems[8];
        local_428.data._M_elems[9] = local_4e8.data._M_elems[9];
        local_428.data._M_elems[10] = local_4e8.data._M_elems[10];
        local_428.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
        local_428.data._M_elems[4] = local_4e8.data._M_elems[4];
        local_428.data._M_elems[5] = local_4e8.data._M_elems[5];
        local_428.data._M_elems[6] = local_4e8.data._M_elems[6];
        local_428.data._M_elems[7] = local_4e8.data._M_elems[7];
        local_428.data._M_elems[0] = local_4e8.data._M_elems[0];
        local_428.data._M_elems[1] = local_4e8.data._M_elems[1];
        local_428.data._M_elems[2] = local_4e8.data._M_elems[2];
        local_428.data._M_elems[3] = local_4e8.data._M_elems[3];
        local_428.exp = local_4e8.exp;
        local_428.neg = local_4e8.neg;
        local_428.fpclass = local_4e8.fpclass;
        local_428.prec_elem = local_4e8.prec_elem;
        multBaseWith(local_430,&local_308,&local_178);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_488,&local_178);
        local_4e8.data._M_elems[0xc] = local_488.data._M_elems[0xc];
        local_4e8.data._M_elems[0xd] = local_488.data._M_elems[0xd];
        local_4e8.data._M_elems[0xe] = local_488.data._M_elems[0xe];
        local_4e8.data._M_elems[0xf] =
             (uint)(CONCAT35(local_488.data._M_elems[0xf]._1_3_,local_488.data._M_elems._56_5_) >>
                   0x20);
        local_4e8.data._M_elems[8] = local_488.data._M_elems[8];
        local_4e8.data._M_elems[9] = local_488.data._M_elems[9];
        local_4e8.data._M_elems[10] = local_488.data._M_elems[10];
        local_4e8.data._M_elems[0xb] = local_488.data._M_elems[0xb];
        local_4e8.data._M_elems[4] = local_488.data._M_elems[4];
        local_4e8.data._M_elems[5] = local_488.data._M_elems[5];
        local_4e8.data._M_elems[6] = local_488.data._M_elems[6];
        local_4e8.data._M_elems[7] = local_488.data._M_elems[7];
        local_4e8.data._M_elems[0] = local_488.data._M_elems[0];
        local_4e8.data._M_elems[1] = local_488.data._M_elems[1];
        local_4e8.data._M_elems[2] = local_488.data._M_elems[2];
        local_4e8.data._M_elems[3] = local_488.data._M_elems[3];
        local_4e8.exp = local_488.exp;
        local_4e8.neg = local_488.neg;
        local_4e8.fpclass = local_488.fpclass;
        local_4e8.prec_elem = local_488.prec_elem;
        if (2 < uVar4) {
          local_d8.fpclass = cpp_dec_float_finite;
          local_d8.prec_elem = 0x10;
          local_d8.data._M_elems[0] = 0;
          local_d8.data._M_elems[1] = 0;
          local_d8.data._M_elems[2] = 0;
          local_d8.data._M_elems[3] = 0;
          local_d8.data._M_elems[4] = 0;
          local_d8.data._M_elems[5] = 0;
          local_d8.data._M_elems[6] = 0;
          local_d8.data._M_elems[7] = 0;
          local_d8.data._M_elems[8] = 0;
          local_d8.data._M_elems[9] = 0;
          local_d8.data._M_elems[10] = 0;
          local_d8.data._M_elems[0xb] = 0;
          local_d8.data._M_elems[0xc] = 0;
          local_d8.data._M_elems[0xd] = 0;
          local_d8.data._M_elems._56_5_ = 0;
          local_d8.data._M_elems[0xf]._1_3_ = 0;
          local_d8.exp = 0;
          local_d8.neg = false;
          local_48c = uVar4;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_d8,&local_4e8,&local_428);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((type *)&local_488,(multiprecision *)&local_d8,arg);
          local_3c8.fpclass = cpp_dec_float_finite;
          local_3c8.prec_elem = 0x10;
          local_3c8.data._M_elems[0] = 0;
          local_3c8.data._M_elems[1] = 0;
          local_3c8.data._M_elems[2] = 0;
          local_3c8.data._M_elems[3] = 0;
          local_3c8.data._M_elems[4] = 0;
          local_3c8.data._M_elems[5] = 0;
          local_3c8.data._M_elems[6] = 0;
          local_3c8.data._M_elems[7] = 0;
          local_3c8.data._M_elems[8] = 0;
          local_3c8.data._M_elems[9] = 0;
          local_3c8.data._M_elems[10] = 0;
          local_3c8.data._M_elems[0xb] = 0;
          local_3c8.data._M_elems[0xc] = 0;
          local_3c8.data._M_elems[0xd] = 0;
          local_3c8.data._M_elems._56_5_ = 0;
          local_3c8.data._M_elems[0xf]._1_3_ = 0;
          local_3c8.exp = 0;
          local_3c8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_3c8,local_3d0,&local_4e8);
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_488,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3c8);
          uVar4 = local_48c;
          if (tVar1) break;
        }
        multWithBase(local_430,&local_178,&local_308);
        local_498 = 1.0;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_3c8,&local_308);
        local_488.fpclass = cpp_dec_float_finite;
        local_488.prec_elem = 0x10;
        local_488.data._M_elems[0] = 0;
        local_488.data._M_elems[1] = 0;
        local_488.data._M_elems[2] = 0;
        local_488.data._M_elems[3] = 0;
        local_488.data._M_elems[4] = 0;
        local_488.data._M_elems[5] = 0;
        local_488.data._M_elems[6] = 0;
        local_488.data._M_elems[7] = 0;
        local_488.data._M_elems[8] = 0;
        local_488.data._M_elems[9] = 0;
        local_488.data._M_elems[10] = 0;
        local_488.data._M_elems[0xb] = 0;
        local_488.data._M_elems[0xc] = 0;
        local_488.data._M_elems[0xd] = 0;
        local_488.data._M_elems._56_5_ = 0;
        local_488.data._M_elems[0xf]._1_3_ = 0;
        local_488.exp = 0;
        local_488.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  (&local_488,&local_498,&local_3c8);
        local_428.data._M_elems[0xc] = local_488.data._M_elems[0xc];
        local_428.data._M_elems[0xd] = local_488.data._M_elems[0xd];
        local_428.data._M_elems[0xe] = local_488.data._M_elems[0xe];
        local_428.data._M_elems[0xf] =
             (uint)(CONCAT35(local_488.data._M_elems[0xf]._1_3_,local_488.data._M_elems._56_5_) >>
                   0x20);
        local_428.data._M_elems[8] = local_488.data._M_elems[8];
        local_428.data._M_elems[9] = local_488.data._M_elems[9];
        local_428.data._M_elems[10] = local_488.data._M_elems[10];
        local_428.data._M_elems[0xb] = local_488.data._M_elems[0xb];
        local_428.data._M_elems[4] = local_488.data._M_elems[4];
        local_428.data._M_elems[5] = local_488.data._M_elems[5];
        local_428.data._M_elems[6] = local_488.data._M_elems[6];
        local_428.data._M_elems[7] = local_488.data._M_elems[7];
        local_428.data._M_elems[0] = local_488.data._M_elems[0];
        local_428.data._M_elems[1] = local_488.data._M_elems[1];
        local_428.data._M_elems[2] = local_488.data._M_elems[2];
        local_428.data._M_elems[3] = local_488.data._M_elems[3];
        local_428.exp = local_488.exp;
        local_428.neg = local_488.neg;
        local_268.m_backend.fpclass = local_488.fpclass;
        local_268.m_backend.prec_elem = local_488.prec_elem;
        local_428.fpclass = local_488.fpclass;
        local_428.prec_elem = local_488.prec_elem;
        local_268.m_backend.data._M_elems[0xf] = local_428.data._M_elems[0xf];
        local_268.m_backend.data._M_elems[0xe] = local_428.data._M_elems[0xe];
        local_268.m_backend.data._M_elems[0xc] = local_488.data._M_elems[0xc];
        local_268.m_backend.data._M_elems[0xd] = local_488.data._M_elems[0xd];
        local_268.m_backend.data._M_elems[8] = local_488.data._M_elems[8];
        local_268.m_backend.data._M_elems[9] = local_488.data._M_elems[9];
        local_268.m_backend.data._M_elems[10] = local_488.data._M_elems[10];
        local_268.m_backend.data._M_elems[0xb] = local_488.data._M_elems[0xb];
        local_268.m_backend.data._M_elems[4] = local_488.data._M_elems[4];
        local_268.m_backend.data._M_elems[5] = local_488.data._M_elems[5];
        local_268.m_backend.data._M_elems[6] = local_488.data._M_elems[6];
        local_268.m_backend.data._M_elems[7] = local_488.data._M_elems[7];
        local_268.m_backend.data._M_elems[0] = local_488.data._M_elems[0];
        local_268.m_backend.data._M_elems[1] = local_488.data._M_elems[1];
        local_268.m_backend.data._M_elems[2] = local_488.data._M_elems[2];
        local_268.m_backend.data._M_elems[3] = local_488.data._M_elems[3];
        local_268.m_backend.exp = local_488.exp;
        local_268.m_backend.neg = local_488.neg;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)&local_308,&local_268);
      }
      local_358.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
      local_358.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
      local_358.data._M_elems._56_5_ =
           SUB85(CONCAT44(local_4e8.data._M_elems[0xf],local_4e8.data._M_elems[0xe]),0);
      local_358.data._M_elems[0xf]._1_3_ = (undefined3)(local_4e8.data._M_elems[0xf] >> 8);
      local_358.data._M_elems[8] = local_4e8.data._M_elems[8];
      local_358.data._M_elems[9] = local_4e8.data._M_elems[9];
      local_358.data._M_elems[10] = local_4e8.data._M_elems[10];
      local_358.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
      local_358.data._M_elems[4] = local_4e8.data._M_elems[4];
      local_358.data._M_elems[5] = local_4e8.data._M_elems[5];
      local_358.data._M_elems[6] = local_4e8.data._M_elems[6];
      local_358.data._M_elems[7] = local_4e8.data._M_elems[7];
      local_358.data._M_elems[0] = local_4e8.data._M_elems[0];
      local_358.data._M_elems[1] = local_4e8.data._M_elems[1];
      local_358.data._M_elems[2] = local_4e8.data._M_elems[2];
      local_358.data._M_elems[3] = local_4e8.data._M_elems[3];
      local_358.exp = local_4e8.exp;
      local_358.neg = local_4e8.neg;
      local_358.fpclass = local_4e8.fpclass;
      local_358.prec_elem = local_4e8.prec_elem;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_308);
      uVar4 = local_434;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&local_178);
      local_498 = 1.0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_3c8,i,(type *)0x0);
      local_488.fpclass = cpp_dec_float_finite;
      local_488.prec_elem = 0x10;
      local_488.data._M_elems[0] = 0;
      local_488.data._M_elems[1] = 0;
      local_488.data._M_elems[2] = 0;
      local_488.data._M_elems[3] = 0;
      local_488.data._M_elems[4] = 0;
      local_488.data._M_elems[5] = 0;
      local_488.data._M_elems[6] = 0;
      local_488.data._M_elems[7] = 0;
      local_488.data._M_elems[8] = 0;
      local_488.data._M_elems[9] = 0;
      local_488.data._M_elems[10] = 0;
      local_488.data._M_elems[0xb] = 0;
      local_488.data._M_elems[0xc] = 0;
      local_488.data._M_elems[0xd] = 0;
      local_488.data._M_elems._56_5_ = 0;
      local_488.data._M_elems[0xf]._1_3_ = 0;
      local_488.exp = 0;
      local_488.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&local_488,&local_498,&local_3c8);
      local_4e8.data._M_elems[0xc] = local_488.data._M_elems[0xc];
      local_4e8.data._M_elems[0xd] = local_488.data._M_elems[0xd];
      local_4e8.data._M_elems[0xe] = local_488.data._M_elems[0xe];
      local_4e8.data._M_elems[0xf] =
           (uint)(CONCAT35(local_488.data._M_elems[0xf]._1_3_,local_488.data._M_elems._56_5_) >>
                 0x20);
      local_4e8.data._M_elems[8] = local_488.data._M_elems[8];
      local_4e8.data._M_elems[9] = local_488.data._M_elems[9];
      local_4e8.data._M_elems[10] = local_488.data._M_elems[10];
      local_4e8.data._M_elems[0xb] = local_488.data._M_elems[0xb];
      local_4e8.data._M_elems[4] = local_488.data._M_elems[4];
      local_4e8.data._M_elems[5] = local_488.data._M_elems[5];
      local_4e8.data._M_elems[6] = local_488.data._M_elems[6];
      local_4e8.data._M_elems[7] = local_488.data._M_elems[7];
      local_4e8.data._M_elems[0] = local_488.data._M_elems[0];
      local_4e8.data._M_elems[1] = local_488.data._M_elems[1];
      local_4e8.data._M_elems[2] = local_488.data._M_elems[2];
      local_4e8.data._M_elems[3] = local_488.data._M_elems[3];
      local_4e8.exp = local_488.exp;
      local_4e8.neg = local_488.neg;
      local_4e8.fpclass = local_488.fpclass;
      local_4e8.prec_elem = local_488.prec_elem;
      for (iVar2 = 0; p_dim != iVar2; iVar2 = iVar2 + 1) {
        local_218.m_backend.data._M_elems[0xf] = local_4e8.data._M_elems[0xf];
        local_218.m_backend.data._M_elems[0xe] = local_4e8.data._M_elems[0xe];
        local_218.m_backend.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
        local_218.m_backend.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
        local_218.m_backend.data._M_elems[8] = local_4e8.data._M_elems[8];
        local_218.m_backend.data._M_elems[9] = local_4e8.data._M_elems[9];
        local_218.m_backend.data._M_elems[10] = local_4e8.data._M_elems[10];
        local_218.m_backend.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
        local_218.m_backend.data._M_elems[4] = local_4e8.data._M_elems[4];
        local_218.m_backend.data._M_elems[5] = local_4e8.data._M_elems[5];
        local_218.m_backend.data._M_elems[6] = local_4e8.data._M_elems[6];
        local_218.m_backend.data._M_elems[7] = local_4e8.data._M_elems[7];
        local_218.m_backend.data._M_elems[0] = local_4e8.data._M_elems[0];
        local_218.m_backend.data._M_elems[1] = local_4e8.data._M_elems[1];
        local_218.m_backend.data._M_elems[2] = local_4e8.data._M_elems[2];
        local_218.m_backend.data._M_elems[3] = local_4e8.data._M_elems[3];
        local_218.m_backend.exp = local_4e8.exp;
        local_218.m_backend.neg = local_4e8.neg;
        local_218.m_backend.fpclass = local_4e8.fpclass;
        local_218.m_backend.prec_elem = local_4e8.prec_elem;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_308,iVar2,&local_218);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_178,&local_308);
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        local_428.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
        local_428.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
        local_428.data._M_elems[0xe] = local_4e8.data._M_elems[0xe];
        local_428.data._M_elems[0xf] = local_4e8.data._M_elems[0xf];
        local_428.data._M_elems[8] = local_4e8.data._M_elems[8];
        local_428.data._M_elems[9] = local_4e8.data._M_elems[9];
        local_428.data._M_elems[10] = local_4e8.data._M_elems[10];
        local_428.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
        local_428.data._M_elems[4] = local_4e8.data._M_elems[4];
        local_428.data._M_elems[5] = local_4e8.data._M_elems[5];
        local_428.data._M_elems[6] = local_4e8.data._M_elems[6];
        local_428.data._M_elems[7] = local_4e8.data._M_elems[7];
        local_428.data._M_elems[0] = local_4e8.data._M_elems[0];
        local_428.data._M_elems[1] = local_4e8.data._M_elems[1];
        local_428.data._M_elems[2] = local_4e8.data._M_elems[2];
        local_428.data._M_elems[3] = local_4e8.data._M_elems[3];
        local_428.exp = local_4e8.exp;
        local_428.neg = local_4e8.neg;
        local_428.fpclass = local_4e8.fpclass;
        local_428.prec_elem = local_4e8.prec_elem;
        (*local_430->factor->_vptr_SLinSolver[0xd])(local_430->factor,&local_308,&local_178);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(&local_308);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_488,&local_308);
        local_4e8.data._M_elems[0xc] = local_488.data._M_elems[0xc];
        local_4e8.data._M_elems[0xd] = local_488.data._M_elems[0xd];
        local_4e8.data._M_elems[0xe] = local_488.data._M_elems[0xe];
        local_4e8.data._M_elems[0xf] =
             (uint)(CONCAT35(local_488.data._M_elems[0xf]._1_3_,local_488.data._M_elems._56_5_) >>
                   0x20);
        local_4e8.data._M_elems[8] = local_488.data._M_elems[8];
        local_4e8.data._M_elems[9] = local_488.data._M_elems[9];
        local_4e8.data._M_elems[10] = local_488.data._M_elems[10];
        local_4e8.data._M_elems[0xb] = local_488.data._M_elems[0xb];
        local_4e8.data._M_elems[4] = local_488.data._M_elems[4];
        local_4e8.data._M_elems[5] = local_488.data._M_elems[5];
        local_4e8.data._M_elems[6] = local_488.data._M_elems[6];
        local_4e8.data._M_elems[7] = local_488.data._M_elems[7];
        local_4e8.data._M_elems[0] = local_488.data._M_elems[0];
        local_4e8.data._M_elems[1] = local_488.data._M_elems[1];
        local_4e8.data._M_elems[2] = local_488.data._M_elems[2];
        local_4e8.data._M_elems[3] = local_488.data._M_elems[3];
        local_4e8.exp = local_488.exp;
        local_4e8.neg = local_488.neg;
        local_4e8.fpclass = local_488.fpclass;
        local_4e8.prec_elem = local_488.prec_elem;
        if (2 < uVar3) {
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 0x10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems[6] = 0;
          local_128.data._M_elems[7] = 0;
          local_128.data._M_elems[8] = 0;
          local_128.data._M_elems[9] = 0;
          local_128.data._M_elems[10] = 0;
          local_128.data._M_elems[0xb] = 0;
          local_128.data._M_elems[0xc] = 0;
          local_128.data._M_elems[0xd] = 0;
          local_128.data._M_elems._56_5_ = 0;
          local_128.data._M_elems[0xf]._1_3_ = 0;
          local_128.exp = 0;
          local_128.neg = false;
          local_48c = uVar3;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_128,&local_4e8,&local_428);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((type *)&local_488,(multiprecision *)&local_128,arg_00);
          local_3c8.fpclass = cpp_dec_float_finite;
          local_3c8.prec_elem = 0x10;
          local_3c8.data._M_elems[0] = 0;
          local_3c8.data._M_elems[1] = 0;
          local_3c8.data._M_elems[2] = 0;
          local_3c8.data._M_elems[3] = 0;
          local_3c8.data._M_elems[4] = 0;
          local_3c8.data._M_elems[5] = 0;
          local_3c8.data._M_elems[6] = 0;
          local_3c8.data._M_elems[7] = 0;
          local_3c8.data._M_elems[8] = 0;
          local_3c8.data._M_elems[9] = 0;
          local_3c8.data._M_elems[10] = 0;
          local_3c8.data._M_elems[0xb] = 0;
          local_3c8.data._M_elems[0xc] = 0;
          local_3c8.data._M_elems[0xd] = 0;
          local_3c8.data._M_elems._56_5_ = 0;
          local_3c8.data._M_elems[0xf]._1_3_ = 0;
          local_3c8.exp = 0;
          local_3c8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_3c8,local_3d0,&local_4e8);
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_488,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_3c8);
          uVar3 = local_48c;
          if (tVar1) break;
        }
        (*local_430->factor->_vptr_SLinSolver[0x15])(local_430->factor,&local_178,&local_308);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setup(&local_178);
        local_498 = 1.0;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_3c8,&local_178);
        local_488.fpclass = cpp_dec_float_finite;
        local_488.prec_elem = 0x10;
        local_488.data._M_elems[0] = 0;
        local_488.data._M_elems[1] = 0;
        local_488.data._M_elems[2] = 0;
        local_488.data._M_elems[3] = 0;
        local_488.data._M_elems[4] = 0;
        local_488.data._M_elems[5] = 0;
        local_488.data._M_elems[6] = 0;
        local_488.data._M_elems[7] = 0;
        local_488.data._M_elems[8] = 0;
        local_488.data._M_elems[9] = 0;
        local_488.data._M_elems[10] = 0;
        local_488.data._M_elems[0xb] = 0;
        local_488.data._M_elems[0xc] = 0;
        local_488.data._M_elems[0xd] = 0;
        local_488.data._M_elems._56_5_ = 0;
        local_488.data._M_elems[0xf]._1_3_ = 0;
        local_488.exp = 0;
        local_488.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  (&local_488,&local_498,&local_3c8);
        local_428.data._M_elems[0xc] = local_488.data._M_elems[0xc];
        local_428.data._M_elems[0xd] = local_488.data._M_elems[0xd];
        local_428.data._M_elems[0xe] = local_488.data._M_elems[0xe];
        local_428.data._M_elems[0xf] =
             (uint)(CONCAT35(local_488.data._M_elems[0xf]._1_3_,local_488.data._M_elems._56_5_) >>
                   0x20);
        local_428.data._M_elems[8] = local_488.data._M_elems[8];
        local_428.data._M_elems[9] = local_488.data._M_elems[9];
        local_428.data._M_elems[10] = local_488.data._M_elems[10];
        local_428.data._M_elems[0xb] = local_488.data._M_elems[0xb];
        local_428.data._M_elems[4] = local_488.data._M_elems[4];
        local_428.data._M_elems[5] = local_488.data._M_elems[5];
        local_428.data._M_elems[6] = local_488.data._M_elems[6];
        local_428.data._M_elems[7] = local_488.data._M_elems[7];
        local_428.data._M_elems[0] = local_488.data._M_elems[0];
        local_428.data._M_elems[1] = local_488.data._M_elems[1];
        local_428.data._M_elems[2] = local_488.data._M_elems[2];
        local_428.data._M_elems[3] = local_488.data._M_elems[3];
        local_428.exp = local_488.exp;
        local_428.neg = local_488.neg;
        local_2b8.m_backend.fpclass = local_488.fpclass;
        local_2b8.m_backend.prec_elem = local_488.prec_elem;
        local_428.fpclass = local_488.fpclass;
        local_428.prec_elem = local_488.prec_elem;
        local_2b8.m_backend.data._M_elems[0xf] = local_428.data._M_elems[0xf];
        local_2b8.m_backend.data._M_elems[0xe] = local_428.data._M_elems[0xe];
        local_2b8.m_backend.data._M_elems[0xc] = local_488.data._M_elems[0xc];
        local_2b8.m_backend.data._M_elems[0xd] = local_488.data._M_elems[0xd];
        local_2b8.m_backend.data._M_elems[8] = local_488.data._M_elems[8];
        local_2b8.m_backend.data._M_elems[9] = local_488.data._M_elems[9];
        local_2b8.m_backend.data._M_elems[10] = local_488.data._M_elems[10];
        local_2b8.m_backend.data._M_elems[0xb] = local_488.data._M_elems[0xb];
        local_2b8.m_backend.data._M_elems[4] = local_488.data._M_elems[4];
        local_2b8.m_backend.data._M_elems[5] = local_488.data._M_elems[5];
        local_2b8.m_backend.data._M_elems[6] = local_488.data._M_elems[6];
        local_2b8.m_backend.data._M_elems[7] = local_488.data._M_elems[7];
        local_2b8.m_backend.data._M_elems[0] = local_488.data._M_elems[0];
        local_2b8.m_backend.data._M_elems[1] = local_488.data._M_elems[1];
        local_2b8.m_backend.data._M_elems[2] = local_488.data._M_elems[2];
        local_2b8.m_backend.data._M_elems[3] = local_488.data._M_elems[3];
        local_2b8.m_backend.exp = local_488.exp;
        local_2b8.m_backend.neg = local_488.neg;
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)&local_178,&local_2b8);
      }
      local_88.data._M_elems[0xc] = local_4e8.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_4e8.data._M_elems[0xd];
      local_88.data._M_elems._56_5_ =
           SUB85(CONCAT44(local_4e8.data._M_elems[0xf],local_4e8.data._M_elems[0xe]),0);
      local_88.data._M_elems[0xf]._1_3_ = (undefined3)(local_4e8.data._M_elems[0xf] >> 8);
      local_88.data._M_elems[8] = local_4e8.data._M_elems[8];
      local_88.data._M_elems[9] = local_4e8.data._M_elems[9];
      local_88.data._M_elems[10] = local_4e8.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_4e8.data._M_elems[0xb];
      local_88.data._M_elems[4] = local_4e8.data._M_elems[4];
      local_88.data._M_elems[5] = local_4e8.data._M_elems[5];
      local_88.data._M_elems[6] = local_4e8.data._M_elems[6];
      local_88.data._M_elems[7] = local_4e8.data._M_elems[7];
      local_88.data._M_elems[0] = local_4e8.data._M_elems[0];
      local_88.data._M_elems[1] = local_4e8.data._M_elems[1];
      local_88.data._M_elems[2] = local_4e8.data._M_elems[2];
      local_88.data._M_elems[3] = local_4e8.data._M_elems[3];
      local_88.exp = local_4e8.exp;
      local_88.neg = local_4e8.neg;
      local_88.fpclass = local_4e8.fpclass;
      local_88.prec_elem = local_4e8.prec_elem;
      local_3d8->fpclass = cpp_dec_float_finite;
      local_3d8->prec_elem = 0x10;
      (local_3d8->data)._M_elems[0] = 0;
      (local_3d8->data)._M_elems[1] = 0;
      (local_3d8->data)._M_elems[2] = 0;
      (local_3d8->data)._M_elems[3] = 0;
      (local_3d8->data)._M_elems[4] = 0;
      (local_3d8->data)._M_elems[5] = 0;
      (local_3d8->data)._M_elems[6] = 0;
      (local_3d8->data)._M_elems[7] = 0;
      (local_3d8->data)._M_elems[8] = 0;
      (local_3d8->data)._M_elems[9] = 0;
      (local_3d8->data)._M_elems[10] = 0;
      (local_3d8->data)._M_elems[0xb] = 0;
      (local_3d8->data)._M_elems[0xc] = 0;
      (local_3d8->data)._M_elems[0xd] = 0;
      (local_3d8->data)._M_elems[0xe] = 0;
      (local_3d8->data)._M_elems[0xf] = 0;
      *(undefined8 *)((long)(local_3d8->data)._M_elems + 0x3d) = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (local_3d8,&local_358,&local_88);
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_178);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(&local_308);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_3d8;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}